

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zetMetricDecoderCreateExp
          (zet_metric_tracer_exp_handle_t hMetricTracer,
          zet_metric_decoder_exp_handle_t *phMetricDecoder)

{
  ze_result_t zVar1;
  
  if (DAT_0010d7a8 != (code *)0x0) {
    zVar1 = (*DAT_0010d7a8)();
    return zVar1;
  }
  context_t::get()::count = (zet_metric_decoder_exp_handle_t)((long)context_t::get()::count + 1);
  *phMetricDecoder = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderCreateExp(
        zet_metric_tracer_exp_handle_t hMetricTracer,   ///< [in] handle of the metric tracer
        zet_metric_decoder_exp_handle_t* phMetricDecoder///< [out] handle of the metric decoder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExp = context.zetDdiTable.MetricDecoderExp.pfnCreateExp;
        if( nullptr != pfnCreateExp )
        {
            result = pfnCreateExp( hMetricTracer, phMetricDecoder );
        }
        else
        {
            // generic implementation
            *phMetricDecoder = reinterpret_cast<zet_metric_decoder_exp_handle_t>( context.get() );

        }

        return result;
    }